

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O2

WallTime __thiscall
miniros::TimeBase<miniros::WallTime,_miniros::WallDuration>::operator+
          (TimeBase<miniros::WallTime,_miniros::WallDuration> *this,WallDuration *rhs)

{
  int64_t nsec_sum;
  int64_t sec_sum;
  long local_28;
  long local_20;
  TimeBase<miniros::WallTime,_miniros::WallDuration> local_18;
  
  local_20 = (long)(rhs->super_DurationBase<miniros::WallDuration>).sec + (ulong)this->sec;
  local_28 = (long)(rhs->super_DurationBase<miniros::WallDuration>).nsec + (ulong)this->nsec;
  normalizeSecNSecUnsigned(&local_20,&local_28);
  TimeBase(&local_18,(uint32_t)local_20,(uint32_t)local_28);
  return (WallTime)local_18;
}

Assistant:

T TimeBase<T, D>::operator+(const D &rhs) const
  {
    int64_t sec_sum  = static_cast<uint64_t>(sec) + static_cast<uint64_t>(rhs.sec);
    int64_t nsec_sum = static_cast<uint64_t>(nsec) + static_cast<uint64_t>(rhs.nsec);

    // Throws an exception if we go out of 32-bit range
    normalizeSecNSecUnsigned(sec_sum, nsec_sum);

    // now, it's safe to downcast back to uint32 bits
    return T(static_cast<uint32_t>(sec_sum), static_cast<uint32_t>(nsec_sum));
  }